

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

char * Kit_DsdWriteHex(char *pBuff,uint *pTruth,int nFans)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  
  uVar1 = (long)(1 << ((byte)nFans & 0x1f)) / 4;
  uVar4 = uVar1 & 0xffffffff;
  iVar6 = (int)uVar1 * 4;
  while( true ) {
    iVar6 = iVar6 + -4;
    if ((int)uVar4 < 1) break;
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
    uVar3 = pTruth[uVar3 >> 3] >> ((byte)iVar6 & 0x1c) & 0xf;
    cVar2 = (char)uVar3;
    cVar5 = cVar2 + '7';
    if (uVar3 < 10) {
      cVar5 = cVar2 + '0';
    }
    *pBuff = cVar5;
    pBuff = pBuff + 1;
  }
  return pBuff;
}

Assistant:

char * Kit_DsdWriteHex( char * pBuff, unsigned * pTruth, int nFans )
{
    int nDigits, Digit, k;
    nDigits = (1 << nFans) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((pTruth[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            *pBuff++ = '0' + Digit;
        else
            *pBuff++ = 'A' + Digit-10;
    }
    return pBuff;
}